

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent(QGraphicsSceneMouseEvent *this,Type type)

{
  QGraphicsSceneMouseEventPrivate *this_00;
  undefined4 in_ESI;
  QGraphicsSceneEventPrivate *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (QGraphicsSceneMouseEventPrivate *)operator_new(0xa0);
  QGraphicsSceneMouseEventPrivate::QGraphicsSceneMouseEventPrivate(this_00);
  QGraphicsSceneEvent::QGraphicsSceneEvent
            ((QGraphicsSceneEvent *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI,
             (Type)((ulong)this_00 >> 0x20));
  in_RDI->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneMouseEvent_00d34a90;
  return;
}

Assistant:

QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneMouseEventPrivate, type)
{
}